

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O3

void __thiscall
sznet::net::KcpWithTcpServer::removeConnectionInLoop(KcpWithTcpServer *this,TcpConnectionPtr *conn)

{
  KcpTcpEventLoop *this_00;
  ulong uVar1;
  element_type *peVar2;
  size_t sVar3;
  EventLoop *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SourceFile file;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  pVar8;
  Logger local_1018;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = this->m_loop;
  bVar5 = EventLoop::isInLoopThread(&this_00->super_EventLoop);
  if (!bVar5) {
    EventLoop::abortNotInLoopThread(&this_00->super_EventLoop);
  }
  if (g_logLevel < 3) {
    file._8_8_ = 0x14;
    file.m_data = "KcpWithTcpServer.cpp";
    Logger::Logger(&local_1018,file,0x5f);
    uVar7 = (long)&local_1018 + (0xfb0 - (long)local_1018.m_impl.m_stream.m_buffer.m_cur);
    if (0x2a < (uint)uVar7) {
      builtin_strncpy(local_1018.m_impl.m_stream.m_buffer.m_cur,
                      "KcpWithTcpServer::removeConnectionInLoop [",0x2a);
      local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + 0x2a;
      uVar7 = (long)&local_1018 + (0xfb0 - (long)local_1018.m_impl.m_stream.m_buffer.m_cur);
    }
    uVar1 = (this->m_name)._M_string_length;
    if (uVar1 < (ulong)(long)(int)uVar7) {
      memcpy(local_1018.m_impl.m_stream.m_buffer.m_cur,(this->m_name)._M_dataplus._M_p,uVar1);
      local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + uVar1;
      uVar7 = (long)&local_1018 + (0xfb0 - (long)local_1018.m_impl.m_stream.m_buffer.m_cur);
    }
    if ((uVar7 & 0xfffffff0) != 0) {
      builtin_strncpy(local_1018.m_impl.m_stream.m_buffer.m_cur,"] - connection ",0xf);
      local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + 0xf;
      uVar7 = (long)&local_1018 + (0xfb0 - (long)local_1018.m_impl.m_stream.m_buffer.m_cur);
    }
    peVar2 = (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar1 = (peVar2->m_name)._M_string_length;
    if (uVar1 < (ulong)(long)(int)uVar7) {
      memcpy(local_1018.m_impl.m_stream.m_buffer.m_cur,(peVar2->m_name)._M_dataplus._M_p,uVar1);
      local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + uVar1;
      uVar7 = (long)&local_1018 + (0xfb0 - (long)local_1018.m_impl.m_stream.m_buffer.m_cur);
    }
    if ((uVar7 & 0xfffffffc) != 0) {
      local_1018.m_impl.m_stream.m_buffer.m_cur[2] = ' ';
      local_1018.m_impl.m_stream.m_buffer.m_cur[0] = ' ';
      local_1018.m_impl.m_stream.m_buffer.m_cur[1] = '-';
      local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + 3;
    }
    LogStream::operator<<
              (&local_1018.m_impl.m_stream,
               ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->m_id);
    Logger::~Logger(&local_1018);
  }
  local_1018.m_impl.m_time.m_microSecondsSinceEpoch._0_4_ =
       ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_id;
  pVar8 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
          ::equal_range(&(this->m_connections)._M_t,(key_type *)&local_1018);
  sVar3 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  ::_M_erase_aux(&(this->m_connections)._M_t,(_Base_ptr)pVar8.first._M_node,
                 (_Base_ptr)pVar8.second._M_node);
  if (sVar3 - (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    peVar2 = (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    this_01 = peVar2->m_loop;
    if (this_01 != (EventLoop *)0x0) {
      lVar6 = __dynamic_cast(this_01,&EventLoop::typeinfo,&KcpTcpEventLoop::typeinfo,0);
      if (lVar6 == 0) {
        __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/../base/Types.h"
                      ,0x6e,
                      "To sznet::down_cast(From *) [To = sznet::net::KcpTcpEventLoop *, From = sznet::net::EventLoop]"
                     );
      }
    }
    p_Var4 = (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x28);
    local_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
               ::_M_invoke;
    *(code **)local_48._M_unused._0_8_ = KcpTcpEventLoop::removeTcpConnectionInLoop;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    *(element_type **)((long)local_48._M_unused._0_8_ + 0x10) = peVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48._M_unused._0_8_ + 0x18) =
         p_Var4;
    *(EventLoop **)((long)local_48._M_unused._0_8_ + 0x20) = this_01;
    local_38 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
               ::_M_manager;
    EventLoop::queueInLoop(this_01,(Functor *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    return;
  }
  __assert_fail("n == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
                ,99,
                "void sznet::net::KcpWithTcpServer::removeConnectionInLoop(const TcpConnectionPtr &)"
               );
}

Assistant:

void KcpWithTcpServer::removeConnectionInLoop(const TcpConnectionPtr& conn)
{
	m_loop->assertInLoopThread();
	LOG_INFO << "KcpWithTcpServer::removeConnectionInLoop [" << m_name
		<< "] - connection " << conn->name() << " - " << conn->id();
	size_t n = m_connections.erase(conn->id());
	(void)n;
	assert(n == 1);
	KcpTcpEventLoop* ioLoop = down_cast<KcpTcpEventLoop*>(conn->getLoop());
	ioLoop->queueInLoop(std::bind(&KcpTcpEventLoop::removeTcpConnectionInLoop, ioLoop, conn));
}